

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

SmallVectorImpl<llvm::DWARFFormValue> * __thiscall
llvm::SmallVectorImpl<llvm::DWARFFormValue>::operator=
          (SmallVectorImpl<llvm::DWARFFormValue> *this,SmallVectorImpl<llvm::DWARFFormValue> *RHS)

{
  uint uVar1;
  uint uVar2;
  SmallVectorImpl<llvm::DWARFFormValue> *pSVar3;
  long lVar4;
  ulong uVar5;
  
  if (this == RHS) {
    return this;
  }
  pSVar3 = (SmallVectorImpl<llvm::DWARFFormValue> *)
           (RHS->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
           super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX;
  if (pSVar3 != RHS + 1) {
    pSVar3 = (SmallVectorImpl<llvm::DWARFFormValue> *)
             (this->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
             super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.
             BeginX;
    if (pSVar3 != this + 1) {
      free(pSVar3);
    }
    (this->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
         (RHS->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
         super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX;
    uVar1 = (RHS->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
            super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.
            Capacity;
    (this->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size =
         (RHS->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
         super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size;
    (this->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity =
         uVar1;
    (RHS->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
         RHS + 1;
    (RHS->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity = 0;
    goto LAB_00d6598f;
  }
  uVar1 = (RHS->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
          super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size;
  uVar2 = (this->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
          super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size;
  uVar5 = (ulong)uVar2;
  if (uVar2 < uVar1) {
    if ((this->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
        super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity <
        uVar1) {
      (this->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
      super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size = 0;
      SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 1,(ulong)uVar1,0x30);
LAB_00d65954:
      uVar5 = 0;
    }
    else {
      if (uVar5 == 0) goto LAB_00d65954;
      memmove((this->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
              super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.
              BeginX,pSVar3,uVar5 * 0x30);
    }
    lVar4 = (RHS->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
            super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size -
            uVar5;
    if (lVar4 != 0) {
      memcpy((void *)(uVar5 * 0x30 +
                     (long)(this->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
                           super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.
                           super_SmallVectorBase.BeginX),
             (void *)((long)(RHS->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
                            super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.
                            super_SmallVectorBase.BeginX + uVar5 * 0x30),lVar4 * 0x30);
    }
  }
  else if (uVar1 != 0) {
    memmove((this->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
            super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX
            ,pSVar3,(ulong)uVar1 * 0x30);
  }
  if ((this->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
      super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Capacity <
      uVar1) {
    __assert_fail("N <= capacity()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                  ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
  }
  (this->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
  super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size = uVar1;
LAB_00d6598f:
  (RHS->super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>).
  super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.Size = 0;
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::operator=(SmallVectorImpl<T> &&RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If the RHS isn't small, clear this vector and then steal its buffer.
  if (!RHS.isSmall()) {
    this->destroy_range(this->begin(), this->end());
    if (!this->isSmall()) free(this->begin());
    this->BeginX = RHS.BeginX;
    this->Size = RHS.Size;
    this->Capacity = RHS.Capacity;
    RHS.resetToSmall();
    return *this;
  }

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd = this->begin();
    if (RHSSize)
      NewEnd = std::move(RHS.begin(), RHS.end(), NewEnd);

    // Destroy excess elements and trim the bounds.
    this->destroy_range(NewEnd, this->end());
    this->set_size(RHSSize);

    // Clear the RHS.
    RHS.clear();

    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: this may not actually make any sense if we can efficiently move
  // elements.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->set_size(0);
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::move(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Move-construct the new elements in place.
  this->uninitialized_move(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->set_size(RHSSize);

  RHS.clear();
  return *this;
}